

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
  *this_00;
  cmLocalGenerator *lg;
  cmMakefile *this_01;
  undefined8 uVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  cmValue cVar5;
  mapped_type *pmVar6;
  size_type *psVar7;
  cmTarget *pcVar8;
  string *name;
  cmGeneratorTarget *pcVar9;
  pointer __k;
  string_view arg;
  TargetOrString resolved;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> implicitTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  cmListFileBacktrace bt;
  TargetOrString local_130;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_108;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  cmListFileBacktrace local_b8;
  undefined1 local_a8 [64];
  string local_68;
  cmGeneratorTarget *local_48;
  string *local_40;
  pointer local_38;
  
  __k = (iface->super_cmLinkInterface).Languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (iface->super_cmLinkInterface).Languages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != local_38) {
    this_00 = &(iface->super_cmLinkInterface).LanguageRuntimeLibraries;
    local_48 = this;
    local_40 = config;
    do {
      iVar2 = std::__cxx11::string::compare((char *)__k);
      if (iVar2 == 0) {
LAB_0036163c:
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,__k);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_c8);
          pcVar9 = local_48;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lg = local_48->LocalGenerator;
          GetRuntimeLinkLibrary(&local_68,local_48,__k,local_40);
          this_01 = pcVar9->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"CMAKE_",__k);
          plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
          local_130.String._M_dataplus._M_p = (pointer)&local_130.String.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_130.String.field_2._M_allocated_capacity = *psVar7;
            local_130.String.field_2._8_8_ = plVar4[3];
          }
          else {
            local_130.String.field_2._M_allocated_capacity = *psVar7;
            local_130.String._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_130.String._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_130,(ulong)local_68._M_dataplus._M_p);
          local_a8._0_8_ = local_a8 + 0x10;
          pcVar8 = (cmTarget *)(plVar4 + 2);
          if ((cmTarget *)*plVar4 == pcVar8) {
            local_a8._16_8_ =
                 (pcVar8->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            local_a8._24_8_ = plVar4[3];
          }
          else {
            local_a8._16_8_ =
                 (pcVar8->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            local_a8._0_8_ = (cmTarget *)*plVar4;
          }
          local_a8._8_8_ = plVar4[1];
          *plVar4 = (long)pcVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          cVar5 = cmMakefile::GetDefinition(this_01,(string *)local_a8);
          if ((cmTarget *)local_a8._0_8_ != (cmTarget *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_,(ulong)((long)(TargetType *)local_a8._16_8_ + 1))
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.String._M_dataplus._M_p != &local_130.String.field_2) {
            operator_delete(local_130.String._M_dataplus._M_p,
                            local_130.String.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_e8._0_8_ != (string *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
          if (cVar5.Value != (string *)0x0) {
            arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
            arg._M_len = (cVar5.Value)->_M_string_length;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e8,arg,false);
            pcVar9 = (cmGeneratorTarget *)((long)(local_e8._8_8_ - local_e8._0_8_) >> 5);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::reserve
                      (&local_108,(size_type)pcVar9);
            uVar1 = local_e8._8_8_;
            for (name = (string *)local_e8._0_8_; name != (string *)uVar1; name = name + 1) {
              ResolveTargetReference(&local_130,pcVar9,name,lg);
              pcVar9 = local_130.Target;
              if (local_130.Target != (cmGeneratorTarget *)0x0) {
                local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)local_c8._M_allocated_capacity;
                local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)(local_c8._8_8_ + 8) =
                         *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)(local_c8._8_8_ + 8) =
                         *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                  }
                }
                cmLinkItem::cmLinkItem((cmLinkItem *)local_a8,local_130.Target,false,&local_b8);
                if (local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                pcVar9 = (cmGeneratorTarget *)local_a8;
                std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                          (&local_108,(cmLinkItem *)local_a8);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._56_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._56_8_);
                }
                if ((cmTarget *)local_a8._0_8_ != (cmTarget *)(local_a8 + 0x10)) {
                  pcVar9 = (cmGeneratorTarget *)((long)(TargetType *)local_a8._16_8_ + 1);
                  operator_delete((void *)local_a8._0_8_,(ulong)pcVar9);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130.String._M_dataplus._M_p != &local_130.String.field_2) {
                pcVar9 = (cmGeneratorTarget *)(local_130.String.field_2._M_allocated_capacity + 1);
                operator_delete(local_130.String._M_dataplus._M_p,(ulong)pcVar9);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,
                            (ulong)(local_68.field_2._M_allocated_capacity + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
          }
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,__k);
          local_a8._16_8_ =
               (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_a8._0_8_ =
               (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
               super__Vector_impl_data._M_start;
          local_a8._8_8_ =
               (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
          super__Vector_impl_data._M_start =
               local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_start;
          (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (pmVar6->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_a8);
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_108);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)__k);
        if (iVar2 == 0) goto LAB_0036163c;
      }
      __k = __k + 1;
    } while (__k != local_38);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries(
  const std::string& config, cmOptionalLinkInterface& iface) const
{
  for (std::string const& lang : iface.Languages) {
    if ((lang == "CUDA" || lang == "HIP") &&
        iface.LanguageRuntimeLibraries.find(lang) ==
          iface.LanguageRuntimeLibraries.end()) {
      auto implicitTargets =
        computeImplicitLanguageTargets<cmLinkItem>(lang, config, this);
      iface.LanguageRuntimeLibraries[lang] = std::move(implicitTargets);
    }
  }
}